

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeBlocksGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,string *make,
          string *makefile,string *target,string *makeFlags)

{
  pointer pcVar1;
  int iVar2;
  string *makefileName_1;
  string makefileName;
  string generator;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (make->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + make->_M_string_length);
  if (makeFlags->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(makeFlags->_M_dataplus)._M_p);
  }
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_50);
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (iVar2 == 0) {
LAB_0043384c:
    cmSystemTools::ConvertToOutputPath(&local_70,makefile);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (iVar2 == 0) goto LAB_0043384c;
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (iVar2 == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(makefile->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
      goto LAB_00433920;
    }
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (iVar2 == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
      goto LAB_00433920;
    }
    cmSystemTools::ConvertToOutputPath(&local_70,makefile);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_00433920:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target, const std::string& makeFlags)
{
  std::string command = make;
  if (!makeFlags.empty()) {
    command += " ";
    command += makeFlags;
  }

  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles" || generator == "NMake Makefiles JOM") {
    // For Windows ConvertToOutputPath already adds quotes when required.
    // These need to be escaped, see
    // https://gitlab.kitware.com/cmake/cmake/-/issues/13952
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " /NOLOGO /f ";
    command += makefileName;
    command += " VERBOSE=1 ";
    command += target;
  } else if (generator == "MinGW Makefiles") {
    // no escaping of spaces in this case, see
    // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
    std::string const& makefileName = makefile;
    command += " -f \"";
    command += makefileName;
    command += "\" ";
    command += " VERBOSE=1 ";
    command += target;
  } else if (generator == "Ninja") {
    command += " -v ";
    command += target;
  } else {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " -f \"";
    command += makefileName;
    command += "\" ";
    command += " VERBOSE=1 ";
    command += target;
  }
  return command;
}